

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

TestPreset * __thiscall
cmake::FindPresetForWorkflow<cmCMakePresetsGraph::TestPreset>
          (cmake *this,static_string_view type,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>_>
          *presets,WorkflowStep *step)

{
  const_iterator cVar1;
  string *psVar2;
  string *__k;
  char local_49;
  string local_48;
  static_string_view type_local;
  
  type_local.super_string_view._M_str = type.super_string_view._M_str;
  type_local.super_string_view._M_len = type.super_string_view._M_len;
  __k = &step->PresetName;
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>_>
          ::find(&presets->_M_t,__k);
  if ((_Rb_tree_header *)cVar1._M_node == &(presets->_M_t)._M_impl.super__Rb_tree_header) {
    psVar2 = GetHomeDirectory_abi_cxx11_(this);
    local_49 = '\"';
    cmStrCat<char_const(&)[9],cm::static_string_view&,char_const(&)[12],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char>
              (&local_48,(char (*) [9])"No such ",&type_local,(char (*) [12])0x735ee2,psVar2,
               (char (*) [4])0x75f146,__k,&local_49);
    cmSystemTools::Error(&local_48);
  }
  else if ((char)cVar1._M_node[4]._M_color == _S_black) {
    psVar2 = GetHomeDirectory_abi_cxx11_(this);
    local_49 = '\"';
    cmStrCat<char_const(&)[19],cm::static_string_view&,char_const(&)[12],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char>
              (&local_48,(char (*) [19])"Cannot use hidden ",&type_local,(char (*) [12])0x735ee2,
               psVar2,(char (*) [4])0x75f146,__k,&local_49);
    cmSystemTools::Error(&local_48);
  }
  else if (*(char *)&cVar1._M_node[0x3a]._M_left == '\0') {
    cmStrCat<char_const(&)[20],cm::static_string_view&,char_const(&)[10],std::__cxx11::string_const&,char_const(&)[27]>
              (&local_48,(char (*) [20])"Could not evaluate ",&type_local,(char (*) [10])0x734d3a,
               __k,(char (*) [27])"\": Invalid macro expansion");
    cmSystemTools::Error(&local_48);
  }
  else {
    if (*(char *)&cVar1._M_node[0x23]._M_parent != '\0') {
      return (TestPreset *)&cVar1._M_node[0x1e]._M_parent;
    }
    psVar2 = GetHomeDirectory_abi_cxx11_(this);
    local_49 = '\"';
    cmStrCat<char_const(&)[21],cm::static_string_view&,char_const(&)[12],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char>
              (&local_48,(char (*) [21])"Cannot use disabled ",&type_local,(char (*) [12])0x735ee2,
               psVar2,(char (*) [4])0x75f146,__k,&local_49);
    cmSystemTools::Error(&local_48);
  }
  std::__cxx11::string::~string((string *)&local_48);
  return (TestPreset *)0x0;
}

Assistant:

const T* cmake::FindPresetForWorkflow(
  cm::static_string_view type,
  const std::map<std::string, cmCMakePresetsGraph::PresetPair<T>>& presets,
  const cmCMakePresetsGraph::WorkflowPreset::WorkflowStep& step)
{
  auto it = presets.find(step.PresetName);
  if (it == presets.end()) {
    cmSystemTools::Error(cmStrCat("No such ", type, " preset in ",
                                  this->GetHomeDirectory(), ": \"",
                                  step.PresetName, '"'));
    return nullptr;
  }

  if (it->second.Unexpanded.Hidden) {
    cmSystemTools::Error(cmStrCat("Cannot use hidden ", type, " preset in ",
                                  this->GetHomeDirectory(), ": \"",
                                  step.PresetName, '"'));
    return nullptr;
  }

  if (!it->second.Expanded) {
    cmSystemTools::Error(cmStrCat("Could not evaluate ", type, " preset \"",
                                  step.PresetName,
                                  "\": Invalid macro expansion"));
    return nullptr;
  }

  if (!it->second.Expanded->ConditionResult) {
    cmSystemTools::Error(cmStrCat("Cannot use disabled ", type, " preset in ",
                                  this->GetHomeDirectory(), ": \"",
                                  step.PresetName, '"'));
    return nullptr;
  }

  return &*it->second.Expanded;
}